

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void do_interrupt_all(CPUM68KState_conflict *env,int is_hw)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  abi_ptr_conflict aVar7;
  uint addr;
  uint uVar8;
  target_ulong_conflict tVar9;
  
  uVar2 = env->pc;
  uVar5 = *(uint *)(env[-3].fregs + 2);
  if ((env->features & 1) == 0) {
    uVar3 = uVar2;
    if (is_hw == 0) {
      if (uVar5 == 0x100) {
        aVar7 = env->aregs[7];
        uVar2 = cpu_ldl_mmuidx_ra_m68k(env,aVar7,0,0);
        uVar3 = cpu_ldl_mmuidx_ra_m68k(env,aVar7 + 4,0,0);
        env->pc = uVar3;
        env->aregs[7] = (uVar2 >> 0x1c & 3 | aVar7) + 8;
LAB_006ecf73:
        cpu_m68k_set_sr_m68k(env,uVar2);
        return;
      }
      if (uVar5 == 0x101) {
        *(undefined4 *)((long)env[-3].fregs + 0x18) = 1;
        *(undefined4 *)(env[-3].fregs + 2) = 0x10001;
        cpu_loop_exit_m68k((CPUState *)(env[-0x40].fregs + 2));
      }
      uVar3 = uVar2 + 2;
      if ((uVar5 & 0xfffffff0) != 0x20) {
        uVar3 = uVar2;
      }
    }
    uVar6 = env->sr;
    uVar2 = cpu_m68k_get_ccr_m68k(env);
    uVar1 = env->sr;
    env->sr = uVar1 | 0x2000;
    if (is_hw != 0) {
      env->sr = (env->pending_level & 0xffffffcfU) << 8 | uVar1 & 0xffffe8ff | 0x2000;
    }
    m68k_switch_sp_m68k(env);
    uVar1 = env->aregs[7];
    uVar8 = uVar1 & 0xfffffffc;
    cpu_stl_mmuidx_ra_m68k(env,uVar8 - 4,uVar3,0,0);
    tVar9 = uVar8 - 8;
    cpu_stl_mmuidx_ra_m68k
              (env,tVar9,uVar5 << 0x12 | uVar6 | uVar2 | (uVar1 & 3) << 0x1c | 0x40000000,0,0);
    env->aregs[7] = tVar9;
    aVar7 = uVar5 * 4 + env->vbr;
    goto LAB_006ecf1a;
  }
  if (is_hw == 0) {
    if (uVar5 - 0x20 < 0x10) {
      uVar2 = uVar2 + 2;
    }
    else if (uVar5 == 0x100) {
      uVar3 = env->aregs[7];
      while( true ) {
        uVar2 = cpu_lduw_mmuidx_ra_m68k(env,uVar3,0,0);
        uVar4 = cpu_ldl_mmuidx_ra_m68k(env,uVar3 + 2,0,0);
        env->pc = uVar4;
        aVar7 = uVar3 + 6;
        if ((env->features & 0x40000) == 0) break;
        uVar4 = cpu_lduw_mmuidx_ra_m68k(env,aVar7,0,0);
        uVar5 = uVar4 >> 0xc & 0xf;
        if (uVar5 != 1) {
          if (uVar5 - 2 < 2) {
            aVar7 = uVar3 + 0xc;
          }
          else if (uVar5 == 4) {
            aVar7 = uVar3 + 0x10;
          }
          else if (uVar5 == 7) {
            aVar7 = uVar3 + 0x3c;
          }
          else {
            aVar7 = uVar3 + 8;
          }
          break;
        }
        uVar3 = uVar3 + 8;
        env->aregs[7] = uVar3;
        cpu_m68k_set_sr_m68k(env,uVar2 & 0xffff);
      }
      env->aregs[7] = aVar7;
      uVar2 = uVar2 & 0xffff;
      goto LAB_006ecf73;
    }
  }
  uVar6 = env->sr;
  uVar3 = cpu_m68k_get_ccr_m68k(env);
  uVar6 = uVar3 | uVar6;
  uVar1 = uVar6 & 0x1fff | 0x2000;
  if (is_hw != 0) {
    uVar1 = uVar1 | env->pending_level << 8 | env->sr & 0xd8ff;
  }
  cpu_m68k_set_sr_m68k(env,uVar1 & 0xffff);
  addr = env->aregs[7] & 0xfffffffe;
  uVar8 = *(uint *)(env[-3].fregs + 2);
  switch(uVar8) {
  case 2:
    if ((env->mmu).fault == true) {
      cpu_abort_m68k((CPUState *)(env[-0x40].fregs + 2),"DOUBLE MMU FAULT\n");
    }
    (env->mmu).fault = true;
    cpu_stl_mmuidx_ra_m68k(env,addr - 4,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 8,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0xc,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x10,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x14,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x18,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x1c,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x20,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x24,(env->mmu).ar,0,0);
    cpu_stl_mmuidx_ra_m68k(env,addr - 0x28,(env->mmu).ar,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 0x2a,0,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 0x2c,0,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 0x2e,0,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 0x30,(env->mmu).ssw,0,0);
    tVar9 = addr - 0x34;
    cpu_stl_mmuidx_ra_m68k(env,tVar9,(env->mmu).ar,0,0);
    if ((env->features & 0x40000) != 0) {
      tVar9 = addr - 0x36;
      cpu_stw_mmuidx_ra_m68k(env,tVar9,*(int *)(env[-3].fregs + 2) * 4 + 0x7000,0,0);
    }
    cpu_stl_mmuidx_ra_m68k(env,tVar9 - 4,uVar2,0,0);
    tVar9 = tVar9 - 6;
    cpu_stw_mmuidx_ra_m68k(env,tVar9,uVar6 & 0xffff,0,0);
    (env->mmu).fault = false;
    break;
  case 3:
    if ((env->features & 0x40000) != 0) {
      uVar3 = 0;
LAB_006ecdd1:
      cpu_stl_mmuidx_ra_m68k(env,addr - 4,uVar3,0,0);
      addr = addr - 6;
      uVar3 = *(int *)(env[-3].fregs + 2) * 4 + 0x2000;
LAB_006ecdf2:
      cpu_stw_mmuidx_ra_m68k(env,addr,uVar3,0,0);
    }
    goto LAB_006ecdfc;
  case 4:
  case 5:
  case 6:
  case 7:
  case 9:
    if ((env->features & 0x40000) != 0) {
      uVar3 = env->pc;
      goto LAB_006ecdd1;
    }
LAB_006ecdfc:
    cpu_stl_mmuidx_ra_m68k(env,addr - 4,uVar2,0,0);
    tVar9 = addr - 6;
    cpu_stw_mmuidx_ra_m68k(env,tVar9,uVar6 & 0xffff,0,0);
    break;
  default:
    if ((uVar8 & 0xfffffff8) != 0x18 || ((uVar6 >> 0xc & 1) == 0 || is_hw == 0)) {
      if ((env->features >> 0x12 & 1) == 0) goto LAB_006ecdfc;
      addr = addr - 2;
      uVar3 = uVar8 << 2;
      goto LAB_006ecdf2;
    }
    if ((env->features >> 0x12 & 1) != 0) {
      addr = addr - 2;
      cpu_stw_mmuidx_ra_m68k(env,addr,uVar8 << 2,0,0);
    }
    cpu_stl_mmuidx_ra_m68k(env,addr - 4,uVar2,0,0);
    cpu_stw_mmuidx_ra_m68k(env,addr - 6,uVar6 & 0xffff,0,0);
    env->aregs[7] = addr - 6;
    cpu_m68k_set_sr_m68k(env,uVar1 & 0xefff);
    uVar6 = env->aregs[7] & 0xfffffffe;
    if ((env->features & 0x40000) != 0) {
      uVar6 = uVar6 - 2;
      cpu_stw_mmuidx_ra_m68k(env,uVar6,*(int *)(env[-3].fregs + 2) * 4 + 0x1000,0,0);
    }
    cpu_stl_mmuidx_ra_m68k(env,uVar6 - 4,uVar2,0,0);
    tVar9 = uVar6 - 6;
    cpu_stw_mmuidx_ra_m68k(env,tVar9,uVar1 & 0xffff,0,0);
  }
  env->aregs[7] = tVar9;
  aVar7 = uVar5 * 4 + env->vbr;
LAB_006ecf1a:
  uVar2 = cpu_ldl_mmuidx_ra_m68k(env,aVar7,0,0);
  env->pc = uVar2;
  return;
}

Assistant:

static void do_interrupt_all(CPUM68KState *env, int is_hw)
{
    if (m68k_feature(env, M68K_FEATURE_M68000)) {
        m68k_interrupt_all(env, is_hw);
        return;
    }
    cf_interrupt_all(env, is_hw);
}